

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

void __thiscall absl::lts_20240722::Cord::SetCrcCordState(Cord *this,CrcCordState *state)

{
  bool bVar1;
  Nonnull<cord_internal::CordRepFlat_*> pCVar2;
  Nonnull<CordRep_*> pCVar3;
  CordzInfo *info;
  CordRep *pCVar4;
  CrcCordState local_68 [8];
  Nonnull<CordRep_*> local_60;
  CordRep *rep_2;
  CordzUpdateScope scope;
  CordRep *rep_1;
  CrcCordState local_30 [8];
  Nonnull<CordRep_*> local_28;
  CordRep *rep;
  CrcCordState *pCStack_18;
  MethodIdentifier method;
  CrcCordState *state_local;
  Cord *this_local;
  
  rep._4_4_ = 0x17;
  pCStack_18 = state;
  state_local = (CrcCordState *)this;
  bVar1 = empty(this);
  if (bVar1) {
    InlineRep::MaybeRemoveEmptyCrcNode(&this->contents_);
    absl::lts_20240722::crc_internal::CrcCordState::CrcCordState(local_30,state);
    pCVar3 = (Nonnull<CordRep_*>)absl::lts_20240722::cord_internal::CordRepCrc::New(0,local_30);
    absl::lts_20240722::crc_internal::CrcCordState::~CrcCordState(local_30);
    local_28 = pCVar3;
    InlineRep::EmplaceTree(&this->contents_,pCVar3,kSetExpectedChecksum);
  }
  else {
    bVar1 = InlineRep::is_tree(&this->contents_);
    if (bVar1) {
      info = cord_internal::InlineData::cordz_info((InlineData *)this);
      cord_internal::CordzUpdateScope::CordzUpdateScope
                ((CordzUpdateScope *)&rep_2,info,kSetExpectedChecksum);
      pCVar4 = cord_internal::InlineData::as_tree((InlineData *)this);
      absl::lts_20240722::crc_internal::CrcCordState::CrcCordState(local_68,state);
      pCVar3 = (Nonnull<CordRep_*>)
               absl::lts_20240722::cord_internal::CordRepCrc::New(pCVar4,local_68);
      absl::lts_20240722::crc_internal::CrcCordState::~CrcCordState(local_68);
      local_60 = pCVar3;
      InlineRep::SetTree(&this->contents_,pCVar3,(CordzUpdateScope *)&rep_2);
      cord_internal::CordzUpdateScope::~CordzUpdateScope((CordzUpdateScope *)&rep_2);
    }
    else {
      pCVar2 = InlineRep::MakeFlatWithExtraCapacity(&this->contents_,0);
      absl::lts_20240722::crc_internal::CrcCordState::CrcCordState((CrcCordState *)&scope,state);
      pCVar3 = (Nonnull<CordRep_*>)
               absl::lts_20240722::cord_internal::CordRepCrc::New(pCVar2,(CrcCordState *)&scope);
      absl::lts_20240722::crc_internal::CrcCordState::~CrcCordState((CrcCordState *)&scope);
      InlineRep::EmplaceTree(&this->contents_,pCVar3,kSetExpectedChecksum);
    }
  }
  return;
}

Assistant:

void Cord::SetCrcCordState(crc_internal::CrcCordState state) {
  auto constexpr method = CordzUpdateTracker::kSetExpectedChecksum;
  if (empty()) {
    contents_.MaybeRemoveEmptyCrcNode();
    CordRep* rep = CordRepCrc::New(nullptr, std::move(state));
    contents_.EmplaceTree(rep, method);
  } else if (!contents_.is_tree()) {
    CordRep* rep = contents_.MakeFlatWithExtraCapacity(0);
    rep = CordRepCrc::New(rep, std::move(state));
    contents_.EmplaceTree(rep, method);
  } else {
    const CordzUpdateScope scope(contents_.data_.cordz_info(), method);
    CordRep* rep = CordRepCrc::New(contents_.data_.as_tree(), std::move(state));
    contents_.SetTree(rep, scope);
  }
}